

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

llb_build_key_t * llb_build_key_make_target(char *name)

{
  CAPIBuildKey *this;
  StringRef name_00;
  char *local_68;
  BuildKey *local_50 [2];
  BuildKey local_40;
  BuildKey *local_20;
  char *name_local;
  BuildKey **local_10;
  
  local_20 = (BuildKey *)name;
  this = (CAPIBuildKey *)operator_new(0x38);
  local_10 = local_50;
  name_local = (char *)local_20;
  local_50[0] = local_20;
  if (local_20 == (BuildKey *)0x0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = (char *)strlen((char *)local_20);
  }
  name_00.Length = (size_t)local_68;
  name_00.Data = local_68;
  llbuild::buildsystem::BuildKey::makeTarget(&local_40,local_50[0],name_00);
  anon_unknown.dwarf_1e10c2::CAPIBuildKey::CAPIBuildKey(this,&local_40);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_40);
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_target(const char *name) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeTarget(StringRef(name)));
}